

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_constraints.c
# Opt level: O1

void PrintFinalStats(void *cvode_mem)

{
  uint uVar1;
  long nge;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  uVar1 = CVodeGetNumSteps(cvode_mem,&local_10);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumSteps",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumRhsEvals(cvode_mem,&local_18);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumRhsEvals",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumLinSolvSetups(cvode_mem,&local_20);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinSolvSetups",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumErrTestFails(cvode_mem,&local_50);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumErrTestFails",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumNonlinSolvIters(cvode_mem,&local_38);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "CVodeGetNumNonlinSolvIters",(ulong)uVar1);
  }
  uVar1 = CVodeGetNumNonlinSolvConvFails(cvode_mem,&local_40);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "CVodeGetNumNonlinSolvConvFails",(ulong)uVar1);
  }
  uVar1 = CVodeGetNumStepSolveFails(cvode_mem,&local_48);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumStepSolveFails"
            ,(ulong)uVar1);
  }
  uVar1 = CVodeGetNumJacEvals(cvode_mem,&local_28);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumJacEvals",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumLinRhsEvals(cvode_mem,&local_30);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinRhsEvals",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumGEvals(cvode_mem,&local_58);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumGEvals",
            (ulong)uVar1);
  }
  puts("\nFinal Statistics:");
  printf("nst = %-6ld nfe = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",local_10,local_18,
         local_20,local_30,local_28);
  printf("nni = %-6ld nnf = %-6ld netf = %-6ld    ncfn = %-6ld  nge = %ld\n\n",local_38,local_40,
         local_50,local_48,local_58);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem)
{
  long int nst, nfe, nsetups, nje, nfeLS, nni, nnf, ncfn, netf, nge;
  int retval;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &nnf);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);
  retval = CVodeGetNumStepSolveFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumStepSolveFails", 1);

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  retval = CVodeGetNumGEvals(cvode_mem, &nge);
  check_retval(&retval, "CVodeGetNumGEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",
         nst, nfe, nsetups, nfeLS, nje);
  printf("nni = %-6ld nnf = %-6ld netf = %-6ld    ncfn = %-6ld  nge = %ld\n\n",
         nni, nnf, netf, ncfn, nge);
}